

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_compress_wksp(void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,
                        uint tableLog,void *workSpace,size_t wkspSize)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  S16 norm [256];
  uint count [256];
  uint local_658;
  uint local_654;
  void *local_650;
  ulong local_648;
  void *local_640;
  short local_638 [256];
  uint local_438 [258];
  
  iVar2 = 1 << ((char)tableLog - 1U & 0x1f);
  iVar5 = 0x400;
  if (0xc < tableLog) {
    iVar5 = 1 << ((char)tableLog - 2U & 0x1f);
  }
  if (wkspSize < iVar5 + iVar2 + maxSymbolValue * 2 + 3) {
    return 0xffffffffffffffd4;
  }
  if (1 < srcSize) {
    uVar7 = (ulong)(iVar2 + maxSymbolValue * 2 + 3);
    pvVar1 = (void *)((long)workSpace + uVar7 * 4);
    sVar6 = wkspSize + uVar7 * -4;
    local_658 = maxSymbolValue;
    if (maxSymbolValue == 0) {
      local_658 = 0xff;
    }
    uVar3 = 0xb;
    if (tableLog != 0) {
      uVar3 = tableLog;
    }
    local_650 = dst;
    sVar4 = HIST_count_wksp(local_438,&local_658,src,srcSize,pvVar1,sVar6);
    local_654 = local_658;
    if (0xffffffffffffff88 < sVar4) {
      return sVar4;
    }
    if (sVar4 == srcSize) {
      return 1;
    }
    local_648 = srcSize >> 7;
    if (local_648 <= sVar4 && sVar4 != 1) {
      local_640 = pvVar1;
      uVar3 = FSE_optimalTableLog_internal(uVar3,srcSize,local_658,2);
      sVar4 = FSE_normalizeCount(local_638,uVar3,local_438,srcSize,local_654);
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      sVar4 = FSE_writeNCount(local_650,dstSize,local_638,local_654,uVar3);
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      sVar6 = FSE_buildCTable_wksp
                        ((FSE_CTable *)workSpace,local_638,local_654,uVar3,local_640,sVar6);
      if (0xffffffffffffff88 < sVar6) {
        return sVar6;
      }
      pvVar1 = (void *)((long)local_650 + sVar4);
      sVar6 = FSE_compress_usingCTable_generic
                        (pvVar1,dstSize - sVar4,src,srcSize,(FSE_CTable *)workSpace,
                         (uint)(local_648 + srcSize + 0xc <= dstSize - sVar4));
      if (0xffffffffffffff88 < sVar6) {
        return sVar6;
      }
      if (sVar6 != 0) {
        uVar7 = (long)pvVar1 + (sVar6 - (long)local_650);
        if (srcSize - 1 <= uVar7) {
          return 0;
        }
        return uVar7;
      }
    }
  }
  return 0;
}

Assistant:

size_t FSE_compress_wksp (void* dst, size_t dstSize, const void* src, size_t srcSize, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    unsigned count[FSE_MAX_SYMBOL_VALUE+1];
    S16   norm[FSE_MAX_SYMBOL_VALUE+1];
    FSE_CTable* CTable = (FSE_CTable*)workSpace;
    size_t const CTableSize = FSE_CTABLE_SIZE_U32(tableLog, maxSymbolValue);
    void* scratchBuffer = (void*)(CTable + CTableSize);
    size_t const scratchBufferSize = wkspSize - (CTableSize * sizeof(FSE_CTable));

    /* init conditions */
    if (wkspSize < FSE_WKSP_SIZE_U32(tableLog, maxSymbolValue)) return ERROR(tableLog_tooLarge);
    if (srcSize <= 1) return 0;  /* Not compressible */
    if (!maxSymbolValue) maxSymbolValue = FSE_MAX_SYMBOL_VALUE;
    if (!tableLog) tableLog = FSE_DEFAULT_TABLELOG;

    /* Scan input and build symbol stats */
    {   CHECK_V_F(maxCount, HIST_count_wksp(count, &maxSymbolValue, src, srcSize, scratchBuffer, scratchBufferSize) );
        if (maxCount == srcSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;         /* each symbol present maximum once => not compressible */
        if (maxCount < (srcSize >> 7)) return 0;   /* Heuristic : not compressible enough */
    }

    tableLog = FSE_optimalTableLog(tableLog, srcSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, srcSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(nc_err, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += nc_err;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, scratchBufferSize) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, src, srcSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    /* check compressibility */
    if ( (size_t)(op-ostart) >= srcSize-1 ) return 0;

    return op-ostart;
}